

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

void NodeDump(nodecontext *p,textwriter_conflict *Text)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = (p->NodeSingleton)._Used;
  if (7 < uVar1) {
    pcVar2 = (p->NodeSingleton)._Begin;
    pcVar3 = pcVar2;
    do {
      if (*(node **)pcVar3 != (node *)0x0) {
        NodeDumpObject(*(node **)pcVar3,Text);
        pcVar2 = (p->NodeSingleton)._Begin;
        uVar1 = (p->NodeSingleton)._Used;
      }
      pcVar3 = pcVar3 + 8;
    } while (pcVar3 != pcVar2 + (uVar1 & 0xfffffffffffffff8));
  }
  return;
}

Assistant:

void NodeDump(nodecontext* p,textwriter* Text)
{
    //no NodeLock, because may be stayed locked when dumping after crash
    node **i;
    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i)
            NodeDumpObject(*i,Text);
}